

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraints.cc
# Opt level: O3

uint __thiscall
RigidBodyDynamics::ConstraintSet::AddLoopConstraint
          (ConstraintSet *this,uint idPredecessor,uint idSuccessor,SpatialTransform *XPredecessor,
          SpatialTransform *XSuccessor,SpatialVector *constraintAxisInPredecessor,
          bool enableBaumgarteStabilization,double stabilizationTimeConstant,char *constraintName,
          uint userDefinedId)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  LoopConstraint *this_00;
  pointer puVar3;
  pointer pSVar4;
  iterator __position;
  void *pvVar5;
  long lVar6;
  LoopConstraint *pLVar7;
  RBDLError *this_01;
  uint uVar8;
  ulong uVar9;
  ulong uVar10;
  string *psVar11;
  uint i;
  long lVar12;
  bool bVar13;
  long lVar14;
  Index new_rows;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_int,_unsigned_int>_>,_bool> pVar15;
  allocator_type local_259;
  string nameStr;
  double local_210 [3];
  string local_1f8;
  value_type local_1d8;
  LoopConstraint loopCon;
  
  uVar9 = *(long *)(this + 0x10) - *(long *)(this + 8) >> 2;
  uVar10 = *(long *)(this + 0x100) - *(long *)(this + 0xf8);
  uVar8 = (uint)uVar9;
  if (uVar10 != 0) {
    this_00 = *(LoopConstraint **)(*(long *)(this + 0xf8) + (ulong)((int)(uVar10 >> 4) - 1) * 0x10);
    puVar3 = (this_00->super_Constraint).bodyIds.
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((*puVar3 == idPredecessor) && (puVar3[1] == idSuccessor)) {
      pSVar4 = (this_00->super_Constraint).bodyFrames.
               super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               .
               super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pLVar7 = &loopCon;
      loopCon.super_Constraint.bodyIds.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)((XPredecessor->r).super_Vector3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array[0] -
                    *(double *)
                     &(pSVar4->r).super_Vector3d.
                      super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>);
      loopCon.super_Constraint.bodyFrames.
      super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      .
      super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ._M_impl.super__Vector_impl_data._M_start =
           (pointer)((XPredecessor->r).super_Vector3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array[1] - *(double *)((long)&(pSVar4->r).super_Vector3d + 8));
      loopCon.super_Constraint.bodyFrames.
      super_vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      .
      super__Vector_base<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ._M_impl.super__Vector_impl_data._M_finish =
           (pointer)((XPredecessor->r).super_Vector3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array[2] - *(double *)((long)&(pSVar4->r).super_Vector3d + 0x10));
      loopCon.super_Constraint._vptr_Constraint =
           (_func_int **)
           ((XPredecessor->E).super_Matrix3d.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[0] -
           *(double *)&(pSVar4->E).super_Matrix3d);
      loopCon.super_Constraint.name._M_dataplus._M_p =
           (pointer)((XPredecessor->E).super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[1] - *(double *)((long)&(pSVar4->E).super_Matrix3d + 8));
      loopCon.super_Constraint.name._M_string_length =
           (size_type)
           ((XPredecessor->E).super_Matrix3d.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] -
           *(double *)((long)&(pSVar4->E).super_Matrix3d + 0x10));
      loopCon.super_Constraint.name.field_2._M_allocated_capacity =
           (size_type)
           ((XPredecessor->E).super_Matrix3d.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] -
           *(double *)((long)&(pSVar4->E).super_Matrix3d + 0x18));
      loopCon.super_Constraint.name.field_2._8_8_ =
           (XPredecessor->E).super_Matrix3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[4] -
           *(double *)((long)&(pSVar4->E).super_Matrix3d + 0x20);
      loopCon.super_Constraint._40_8_ =
           (XPredecessor->E).super_Matrix3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[5] -
           *(double *)((long)&(pSVar4->E).super_Matrix3d + 0x28);
      loopCon.super_Constraint._48_8_ =
           (XPredecessor->E).super_Matrix3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[6] -
           *(double *)((long)&(pSVar4->E).super_Matrix3d + 0x30);
      loopCon.super_Constraint.bodyIds.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)((XPredecessor->E).super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[7] - *(double *)((long)&(pSVar4->E).super_Matrix3d + 0x38));
      loopCon.super_Constraint.bodyIds.
      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)((XPredecessor->E).super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[8] - *(double *)((long)&(pSVar4->E).super_Matrix3d + 0x40));
      psVar11 = &nameStr;
      local_210[0] = (XSuccessor->r).super_Vector3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array[0] -
                     *(double *)
                      &pSVar4[1].r.super_Vector3d.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>;
      local_210[1] = (XSuccessor->r).super_Vector3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array[1] - *(double *)((long)&pSVar4[1].r.super_Vector3d + 8);
      local_210[2] = (XSuccessor->r).super_Vector3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                     array[2] - *(double *)((long)&pSVar4[1].r.super_Vector3d + 0x10);
      nameStr._M_dataplus._M_p =
           (pointer)((XSuccessor->E).super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array[0] - *(double *)&pSVar4[1].E.super_Matrix3d);
      nameStr._M_string_length =
           (size_type)
           ((XSuccessor->E).super_Matrix3d.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[1] -
           *(double *)((long)&pSVar4[1].E.super_Matrix3d + 8));
      nameStr.field_2._M_allocated_capacity =
           (size_type)
           ((XSuccessor->E).super_Matrix3d.
            super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[2] -
           *(double *)((long)&pSVar4[1].E.super_Matrix3d + 0x10));
      nameStr.field_2._8_8_ =
           (XSuccessor->E).super_Matrix3d.
           super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array[3] -
           *(double *)((long)&pSVar4[1].E.super_Matrix3d + 0x18);
      bVar13 = true;
      lVar12 = 0;
      do {
        if ((2.220446049250313e-14 <
             ABS(*(double *)
                  ((long)&loopCon.super_Constraint.baumgarteParameters.super_Vector2d.
                          super_PlainObjectBase<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>.m_storage.
                          m_data + lVar12 * 8 + -0x28))) ||
           (2.220446049250313e-14 < ABS(local_210[lVar12]))) {
          bVar13 = false;
        }
        lVar14 = 0;
        do {
          if ((2.220446049250313e-14 <
               ABS(*(double *)
                    ((long)&((Constraint *)(&(pLVar7->super_Constraint).baumgarteParameters + -7))->
                            _vptr_Constraint + lVar14))) ||
             (2.220446049250313e-14 < ABS(*(double *)((long)&(psVar11->_M_dataplus)._M_p + lVar14)))
             ) {
            bVar13 = false;
          }
          lVar14 = lVar14 + 0x18;
        } while (lVar14 != 0x48);
        lVar12 = lVar12 + 1;
        pLVar7 = (LoopConstraint *)&(pLVar7->super_Constraint).name;
        psVar11 = (string *)&psVar11->_M_string_length;
      } while (lVar12 != 3);
      if ((bVar13) && ((this_00->super_Constraint).id == userDefinedId)) {
        LoopConstraint::appendConstraintAxis(this_00,constraintAxisInPredecessor,true,true);
        goto LAB_00138639;
      }
    }
  }
  LoopConstraint::LoopConstraint
            (&loopCon,idPredecessor,idSuccessor,XPredecessor,XSuccessor,constraintAxisInPredecessor,
             enableBaumgarteStabilization,stabilizationTimeConstant,constraintName,userDefinedId,
             true,true);
  nameStr._M_dataplus._M_p = (pointer)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<RigidBodyDynamics::LoopConstraint,std::allocator<RigidBodyDynamics::LoopConstraint>,RigidBodyDynamics::LoopConstraint&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&nameStr._M_string_length,
             (LoopConstraint **)&nameStr,(allocator<RigidBodyDynamics::LoopConstraint> *)&local_1d8,
             &loopCon);
  std::
  vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>>>
  ::emplace_back<std::shared_ptr<RigidBodyDynamics::LoopConstraint>>
            ((vector<std::shared_ptr<RigidBodyDynamics::LoopConstraint>,std::allocator<std::shared_ptr<RigidBodyDynamics::LoopConstraint>>>
              *)(this + 0xf8),(shared_ptr<RigidBodyDynamics::LoopConstraint> *)&nameStr);
  if (nameStr._M_string_length != 0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)nameStr._M_string_length);
  }
  lVar12 = *(long *)(this + 0xf8);
  lVar14 = (ulong)((int)((ulong)(*(long *)(this + 0x100) - lVar12) >> 4) - 1) * 0x10;
  *(uint *)(*(long *)(lVar12 + lVar14) + 0x34) = uVar8;
  std::
  vector<std::shared_ptr<RigidBodyDynamics::Constraint>,std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>>>
  ::emplace_back<std::shared_ptr<RigidBodyDynamics::LoopConstraint>&>
            ((vector<std::shared_ptr<RigidBodyDynamics::Constraint>,std::allocator<std::shared_ptr<RigidBodyDynamics::Constraint>>>
              *)(this + 200),(shared_ptr<RigidBodyDynamics::LoopConstraint> *)(lVar12 + lVar14));
  loopCon.super_Constraint._vptr_Constraint = (_func_int **)&PTR_bind_0019ac68;
  if (loopCon.super_Constraint._216_8_ != 0) {
    free((void *)loopCon.super_Constraint._216_8_);
  }
  Constraint::~Constraint(&loopCon.super_Constraint);
LAB_00138639:
  loopCon.super_Constraint._vptr_Constraint =
       (_func_int **)CONCAT44(loopCon.super_Constraint._vptr_Constraint._4_4_,1);
  __position._M_current = *(ConstraintType **)(this + 0x10);
  if (__position._M_current == *(ConstraintType **)(this + 0x18)) {
    std::
    vector<RigidBodyDynamics::ConstraintType,_std::allocator<RigidBodyDynamics::ConstraintType>_>::
    _M_realloc_insert<RigidBodyDynamics::ConstraintType>
              ((vector<RigidBodyDynamics::ConstraintType,_std::allocator<RigidBodyDynamics::ConstraintType>_>
                *)(this + 8),__position,(ConstraintType *)&loopCon);
  }
  else {
    *__position._M_current = ConstraintTypeLoop;
    *(ConstraintType **)(this + 0x10) = __position._M_current + 1;
  }
  paVar1 = &nameStr.field_2;
  nameStr._M_string_length = 0;
  nameStr.field_2._M_allocated_capacity = nameStr.field_2._M_allocated_capacity & 0xffffffffffffff00
  ;
  nameStr._M_dataplus._M_p = (pointer)paVar1;
  if (constraintName != (char *)0x0) {
    strlen(constraintName);
    std::__cxx11::string::_M_replace((ulong)&nameStr,0,(char *)0x0,(ulong)constraintName);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(this + 0x20),&nameStr);
  uVar10 = uVar9 + 1 & 0xffffffff;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x110),uVar10,uVar10,1);
  uVar9 = uVar9 & 0xffffffff;
  *(undefined8 *)(*(long *)(this + 0x110) + uVar9 * 8) = 0;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x120),uVar10,uVar10,1);
  *(undefined8 *)(*(long *)(this + 0x120) + uVar9 * 8) = 0;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x130),uVar10,uVar10,1);
  *(undefined8 *)(*(long *)(this + 0x130) + uVar9 * 8) = 0;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x140),uVar10,uVar10,1);
  *(undefined8 *)(*(long *)(this + 0x140) + uVar9 * 8) = 0;
  Eigen::DenseStorage<double,_-1,_-1,_1,_0>::conservativeResize
            ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x150),uVar10,uVar10,1);
  ((DenseStorage<double,__1,__1,_1,_0> *)(this + 0x150))->m_data[uVar9] = 0.0;
  local_1d8.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[2] = 0.0;
  local_1d8.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[0] = 0.0;
  local_1d8.super_Vector3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
  m_data.array[1] = 0.0;
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::vector
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)&loopCon,uVar10,&local_1d8,&local_259)
  ;
  pvVar5 = *(void **)(this + 0x600);
  lVar12 = *(long *)(this + 0x610);
  *(_func_int ***)(this + 0x600) = loopCon.super_Constraint._vptr_Constraint;
  *(pointer *)(this + 0x608) = loopCon.super_Constraint.name._M_dataplus._M_p;
  *(size_type *)(this + 0x610) = loopCon.super_Constraint.name._M_string_length;
  loopCon.super_Constraint._vptr_Constraint = (_func_int **)0x0;
  loopCon.super_Constraint.name._M_dataplus._M_p = (pointer)0x0;
  loopCon.super_Constraint.name._M_string_length = 0;
  if (pvVar5 != (void *)0x0) {
    operator_delete(pvVar5,lVar12 - (long)pvVar5);
    if (loopCon.super_Constraint._vptr_Constraint != (_func_int **)0x0) {
      operator_delete(loopCon.super_Constraint._vptr_Constraint,
                      loopCon.super_Constraint.name._M_string_length -
                      (long)loopCon.super_Constraint._vptr_Constraint);
    }
  }
  if (nameStr._M_string_length != 0) {
    lVar12 = *(long *)(this + 0xd0);
    lVar14 = *(long *)(this + 200);
    psVar2 = &loopCon.super_Constraint.name._M_string_length;
    lVar6 = *(long *)(*(long *)(this + 0x28) + -0x20);
    loopCon.super_Constraint._vptr_Constraint = (_func_int **)psVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&loopCon,lVar6,*(long *)(*(long *)(this + 0x28) + -0x18) + lVar6);
    loopCon.super_Constraint.name.field_2._8_4_ = (int)((ulong)(lVar12 - lVar14) >> 4) + -1;
    std::
    _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
    ::_M_emplace_unique<std::pair<std::__cxx11::string,unsigned_int>>
              ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_int>,std::_Select1st<std::pair<std::__cxx11::string_const,unsigned_int>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_int>>>
                *)(this + 0x38),
               (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>
                *)&loopCon);
    if (loopCon.super_Constraint._vptr_Constraint != (_func_int **)psVar2) {
      operator_delete(loopCon.super_Constraint._vptr_Constraint,
                      loopCon.super_Constraint.name._M_string_length + 1);
    }
  }
  if (userDefinedId != 0xffffffff) {
    loopCon.super_Constraint._vptr_Constraint =
         (_func_int **)
         CONCAT44((int)((ulong)(*(long *)(this + 0xd0) - *(long *)(this + 200)) >> 4) + -1,
                  userDefinedId);
    std::
    _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
    ::_M_emplace_unique<std::pair<unsigned_int,unsigned_int>>
              ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                *)(this + 0x68),(pair<unsigned_int,_unsigned_int> *)&loopCon);
  }
  loopCon.super_Constraint._vptr_Constraint =
       (_func_int **)
       CONCAT44((int)((ulong)(*(long *)(this + 0xd0) - *(long *)(this + 200)) >> 4) + -1,uVar8);
  pVar15 = std::
           _Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
           ::_M_emplace_unique<std::pair<unsigned_int,unsigned_int>>
                     ((_Rb_tree<unsigned_int,std::pair<unsigned_int_const,unsigned_int>,std::_Select1st<std::pair<unsigned_int_const,unsigned_int>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,unsigned_int>>>
                       *)(this + 0x98),(pair<unsigned_int,_unsigned_int> *)&loopCon);
  if (pVar15.second != false) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)nameStr._M_dataplus._M_p != paVar1) {
      operator_delete(nameStr._M_dataplus._M_p,nameStr.field_2._M_allocated_capacity + 1);
    }
    return uVar8;
  }
  std::__cxx11::stringstream::stringstream((stringstream *)&loopCon);
  psVar2 = &loopCon.super_Constraint.name._M_string_length;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)psVar2,"Error: Constraint row entry in system is not unique.",0x34);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)psVar2,
             " (This should not be possible: contact the maintainer of this code.)",0x44);
  std::endl<char,std::char_traits<char>>((ostream *)psVar2);
  this_01 = (RBDLError *)__cxa_allocate_exception(0x28);
  std::__cxx11::stringbuf::str();
  Errors::RBDLError::RBDLError(this_01,&local_1f8);
  __cxa_throw(this_01,&Errors::RBDLError::typeinfo,Errors::RBDLError::~RBDLError);
}

Assistant:

unsigned int ConstraintSet::AddLoopConstraint (
  unsigned int idPredecessor,
  unsigned int idSuccessor,
  const Math::SpatialTransform &XPredecessor,
  const Math::SpatialTransform &XSuccessor,
  const Math::SpatialVector &constraintAxisInPredecessor,
  bool enableBaumgarteStabilization,
  double stabilizationTimeConstant,
  const char *constraintName,
  unsigned int userDefinedId)
{
  assert (bound == false);


  unsigned int insertAtRowInG = unsigned(size());
  unsigned int rowsInG = insertAtRowInG+1;

  double tol = std::numeric_limits<double>::epsilon()*100.;
  bool constraintAppended = false;
  unsigned int idx = unsigned(loopConstraints.size());

  if(loopConstraints.size() > 0) {
    idx = idx-1;
    if(loopConstraints[idx]->getBodyIds()[0] == idPredecessor &&
        loopConstraints[idx]->getBodyIds()[1] == idSuccessor) {

      bool framesNumericallyIdentical=true;
      SpatialTransform frameErrorPre, frameErrorSuc;

      frameErrorPre.r=XPredecessor.r-loopConstraints[idx]->getBodyFrames()[0].r;
      frameErrorPre.E=XPredecessor.E-loopConstraints[idx]->getBodyFrames()[0].E;

      frameErrorSuc.r=XSuccessor.r  -loopConstraints[idx]->getBodyFrames()[1].r;
      frameErrorSuc.E=XSuccessor.E  -loopConstraints[idx]->getBodyFrames()[1].E;

      //Using this awkward element by element comparison to maintain
      //compatibility with SimpleMath.
#ifndef RBDL_USE_CASADI_MATH
      for(unsigned int i=0; i<frameErrorPre.r.size(); ++i) {
        if(fabs(frameErrorPre.r[i]) > tol || fabs(frameErrorSuc.r[i]) > tol) {
          framesNumericallyIdentical=false;
        }
        for(unsigned int j=0; j<frameErrorPre.E.cols(); ++j) {
          if(fabs(frameErrorPre.E(i,j))>tol || fabs(frameErrorSuc.E(i,j))>tol) {
            framesNumericallyIdentical=false;
          }
        }
      }
#endif

      if(framesNumericallyIdentical
         && loopConstraints[idx]->getUserDefinedId() == userDefinedId) {
        constraintAppended = true;
        loopConstraints[idx]->appendConstraintAxis(constraintAxisInPredecessor);
      }
    }
  }

  if(constraintAppended==false) {

    LoopConstraint loopCon( idPredecessor, idSuccessor,
                            XPredecessor,  XSuccessor,
                            constraintAxisInPredecessor,
                            enableBaumgarteStabilization,
                            stabilizationTimeConstant,
                            constraintName,
                            userDefinedId);

    loopConstraints.push_back(std::make_shared<LoopConstraint>(loopCon));
    idx = unsigned(loopConstraints.size()-1);
    loopConstraints[idx]->addToConstraintSet(insertAtRowInG);
    constraints.emplace_back(loopConstraints[idx]);
  }

  constraintType.push_back(ConstraintTypeLoop);

  //Update all of the struct arrays so that they have the correct number
  //of elements
  std::string nameStr;
  if (constraintName != NULL) {
    nameStr = constraintName;
  }

  name.push_back (nameStr);


  err.conservativeResize(rowsInG);
  err[insertAtRowInG] = 0.;
  errd.conservativeResize(rowsInG);
  errd[insertAtRowInG] = 0.;

  force.conservativeResize (rowsInG);
  force[insertAtRowInG] = 0.;

  impulse.conservativeResize (rowsInG);
  impulse[insertAtRowInG] = 0.;

  v_plus.conservativeResize (rowsInG);
  v_plus[insertAtRowInG] = 0.;

  d_multdof3_u = std::vector<Math::Vector3d>(rowsInG, Math::Vector3d::Zero());

  //Set up access maps
  if(nameStr.size() > 0) {
    std::pair< std::map<std::string, unsigned int>::iterator, bool > iter;
    iter = nameGroupMap.insert(std::pair<std::string, unsigned int>(
                                 name[name.size()-1],
                                 unsigned(constraints.size()-1)));
    //if(iter.second == false){
    //  std::cerr << "Error: optional name is not unique."
    //            << std::endl;
    //  assert(0);
    //  abort();
    //}

  }

  if(userDefinedId < std::numeric_limits<unsigned int>::max()) {
    std::pair< std::map<unsigned int, unsigned int>::iterator, bool > iter;
    iter =userDefinedIdGroupMap.insert( std::pair<unsigned int, unsigned int>(
                                          userDefinedId,
                                          unsigned(constraints.size()-1)));
    //if(iter.second == false){
    //  std::cerr << "Error: optional userDefinedId is not unique."
    //            << std::endl;
    //  assert(0);
    //  abort();
    //}
  }

  std::pair< std::map<unsigned int, unsigned int>::iterator, bool > iter;
  iter = idGroupMap.insert(std::pair<unsigned int, unsigned int>(
                             unsigned(rowsInG-1),
                             unsigned(constraints.size()-1)));
  if(iter.second == false) {
    std::stringstream errormsg;
    errormsg << "Error: Constraint row entry in system is not unique."
             << " (This should not be possible: contact the "
             "maintainer of this code.)"
             << std::endl;
    throw Errors::RBDLError(errormsg.str());
  }

  return rowsInG-1;
}